

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemIOCallback.cpp
# Opt level: O2

ssize_t __thiscall
libebml::MemIOCallback::write(MemIOCallback *this,int __fd,void *__buf,size_t __n)

{
  binary *__ptr;
  ulong uVar1;
  undefined4 in_register_00000034;
  uint64 uVar2;
  
  __ptr = this->dataBuffer;
  uVar2 = this->dataBufferPos;
  if (this->dataBufferMemorySize < uVar2 + (long)__buf) {
    __ptr = (binary *)realloc(__ptr,uVar2 + (long)__buf);
    this->dataBuffer = __ptr;
    uVar2 = this->dataBufferPos;
  }
  memcpy(__ptr + uVar2,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  uVar1 = this->dataBufferPos + (long)__buf;
  this->dataBufferPos = uVar1;
  if (this->dataBufferTotalSize < uVar1) {
    this->dataBufferTotalSize = uVar1;
  }
  return (ssize_t)__buf;
}

Assistant:

size_t MemIOCallback::write(const void *Buffer, size_t Size)
{
  if (dataBufferMemorySize < dataBufferPos + Size) {
    //We need more memory!
    dataBuffer = (binary *)realloc((void *)dataBuffer, dataBufferPos + Size);
  }
  memcpy(dataBuffer+dataBufferPos, Buffer, Size);
  dataBufferPos += Size;
  if (dataBufferPos > dataBufferTotalSize)
    dataBufferTotalSize = dataBufferPos;

  return Size;
}